

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptMemoryDumper.cpp
# Opt level: O1

void __thiscall
ScriptMemoryDumper::FillObjectWithStats
          (ScriptMemoryDumper *this,DynamicObject *dynamicObject,HeapStats stats)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  Var pvVar4;
  uint64 uVar5;
  uint64 uVar6;
  undefined4 *puVar7;
  double dVar8;
  
  uVar1 = this->pageCountId;
  pvVar4 = Js::JavascriptTypedNumber<unsigned_long>::ToVar(stats.pageCount,this->scriptContext);
  (*(dynamicObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x17])(dynamicObject,(ulong)uVar1,pvVar4,0,0);
  uVar1 = this->objectSizeId;
  dVar8 = (double)stats.objectSize;
  uVar5 = Js::NumberUtilities::ToSpecial(dVar8);
  bVar3 = Js::NumberUtilities::IsNan(dVar8);
  if (bVar3) {
    uVar6 = Js::NumberUtilities::ToSpecial(dVar8);
    if (uVar6 != 0xfff8000000000000) {
      uVar6 = Js::NumberUtilities::ToSpecial(dVar8);
      if (uVar6 != 0x7ff8000000000000) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                           ,0xa2,
                           "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                           ,"We should only produce a NaN with this value");
        if (!bVar3) goto LAB_007b47ee;
        *puVar7 = 0;
      }
    }
  }
  (*(dynamicObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x17])(dynamicObject,(ulong)uVar1,uVar5 ^ 0xfffc000000000000,0,0);
  uVar1 = this->freeObjectCountId;
  dVar8 = (double)stats.freeObjectCount;
  uVar5 = Js::NumberUtilities::ToSpecial(dVar8);
  bVar3 = Js::NumberUtilities::IsNan(dVar8);
  if (bVar3) {
    uVar6 = Js::NumberUtilities::ToSpecial(dVar8);
    if (uVar6 != 0xfff8000000000000) {
      uVar6 = Js::NumberUtilities::ToSpecial(dVar8);
      if (uVar6 != 0x7ff8000000000000) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                           ,0xa2,
                           "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                           ,"We should only produce a NaN with this value");
        if (!bVar3) goto LAB_007b47ee;
        *puVar7 = 0;
      }
    }
  }
  (*(dynamicObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x17])(dynamicObject,(ulong)uVar1,uVar5 ^ 0xfffc000000000000,0,0);
  uVar1 = this->activeObjectCountId;
  dVar8 = (double)stats.activeObjectCount;
  uVar5 = Js::NumberUtilities::ToSpecial(dVar8);
  bVar3 = Js::NumberUtilities::IsNan(dVar8);
  if (bVar3) {
    uVar6 = Js::NumberUtilities::ToSpecial(dVar8);
    if (uVar6 != 0xfff8000000000000) {
      uVar6 = Js::NumberUtilities::ToSpecial(dVar8);
      if (uVar6 != 0x7ff8000000000000) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                           ,0xa2,
                           "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                           ,"We should only produce a NaN with this value");
        if (!bVar3) goto LAB_007b47ee;
        *puVar7 = 0;
      }
    }
  }
  (*(dynamicObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x17])(dynamicObject,(ulong)uVar1,uVar5 ^ 0xfffc000000000000,0,0);
  uVar1 = this->activeObjectByteSizeId;
  pvVar4 = Js::JavascriptTypedNumber<unsigned_long>::ToVar
                     (stats.activeObjectByteSize,this->scriptContext);
  (*(dynamicObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x17])(dynamicObject,(ulong)uVar1,pvVar4,0,0);
  uVar1 = this->totalByteCountId;
  pvVar4 = Js::JavascriptTypedNumber<unsigned_long>::ToVar(stats.totalByteCount,this->scriptContext)
  ;
  (*(dynamicObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x17])(dynamicObject,(ulong)uVar1,pvVar4,0,0);
  uVar1 = this->finalizeCountId;
  dVar8 = (double)stats.finalizeCount;
  uVar5 = Js::NumberUtilities::ToSpecial(dVar8);
  bVar3 = Js::NumberUtilities::IsNan(dVar8);
  if (bVar3) {
    uVar6 = Js::NumberUtilities::ToSpecial(dVar8);
    if (uVar6 != 0xfff8000000000000) {
      uVar6 = Js::NumberUtilities::ToSpecial(dVar8);
      if (uVar6 != 0x7ff8000000000000) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                           ,0xa2,
                           "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                           ,"We should only produce a NaN with this value");
        if (!bVar3) {
LAB_007b47ee:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar7 = 0;
      }
    }
  }
  (*(dynamicObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x17])(dynamicObject,(ulong)uVar1,uVar5 ^ 0xfffc000000000000,0,0);
  return;
}

Assistant:

void ScriptMemoryDumper::FillObjectWithStats(Js::DynamicObject* dynamicObject, HeapStats stats)
{
    dynamicObject->SetProperty(pageCountId, Js::JavascriptUInt64Number::ToVar(stats.pageCount, scriptContext),  Js::PropertyOperation_None, NULL);
    dynamicObject->SetProperty(objectSizeId, Js::JavascriptNumber::New(stats.objectSize, scriptContext),  Js::PropertyOperation_None, NULL);
    dynamicObject->SetProperty(freeObjectCountId, Js::JavascriptNumber::New(stats.freeObjectCount, scriptContext),  Js::PropertyOperation_None, NULL);
    dynamicObject->SetProperty(activeObjectCountId, Js::JavascriptNumber::New(stats.activeObjectCount, scriptContext),  Js::PropertyOperation_None, NULL);
    dynamicObject->SetProperty(activeObjectByteSizeId, Js::JavascriptUInt64Number::ToVar(stats.activeObjectByteSize, scriptContext),  Js::PropertyOperation_None, NULL);
    dynamicObject->SetProperty(totalByteCountId, Js::JavascriptUInt64Number::ToVar(stats.totalByteCount, scriptContext),  Js::PropertyOperation_None, NULL);
    dynamicObject->SetProperty(finalizeCountId, Js::JavascriptNumber::New(stats.finalizeCount, scriptContext),  Js::PropertyOperation_None, NULL);
}